

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int CVodeSetPreconditioner(void *cvode_mem,CVLsPrecSetupFn psetup,CVLsPrecSolveFn psolve)

{
  int iVar1;
  char *fname;
  int error_code;
  char *msgfmt;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeMem local_30;
  CVLsMem local_28;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetPreconditioner",&local_30,&local_28);
  if (iVar1 == 0) {
    local_28->pset = psetup;
    local_28->psolve = psolve;
    if (local_28->LS->ops->setpreconditioner ==
        (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      fname = "CVodeSetPreconditioner";
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      iVar1 = -3;
      error_code = -3;
    }
    else {
      if (psetup != (CVLsPrecSetupFn)0x0) {
        psetup = cvLsPSetup;
      }
      if (psolve != (CVLsPrecSolveFn)0x0) {
        psolve = cvLsPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner
                        (local_28->LS,local_30,(SUNPSetupFn)psetup,(SUNPSolveFn)psolve);
      if (iVar1 == 0) {
        return 0;
      }
      fname = "CVLsSetPreconditioner";
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      iVar1 = -9;
      error_code = -9;
    }
    cvProcessError(local_30,error_code,"CVLS",fname,msgfmt);
  }
  return iVar1;
}

Assistant:

int CVodeSetPreconditioner(void *cvode_mem, CVLsPrecSetupFn psetup,
                           CVLsPrecSolveFn psolve)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  SUNPSetupFn cvls_psetup;
  SUNPSolveFn cvls_psolve;
  int      retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeSetPreconditioner",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* store function pointers for user-supplied routines in CVLs interface */
  cvls_mem->pset   = psetup;
  cvls_mem->psolve = psolve;

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (cvls_mem->LS->ops->setpreconditioner == NULL) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetPreconditioner",
                   "SUNLinearSolver object does not support user-supplied preconditioning");
    return(CVLS_ILL_INPUT);
  }

  /* notify iterative linear solver to call CVLs interface routines */
  cvls_psetup = (psetup == NULL) ? NULL : cvLsPSetup;
  cvls_psolve = (psolve == NULL) ? NULL : cvLsPSolve;
  retval = SUNLinSolSetPreconditioner(cvls_mem->LS, cv_mem,
                                      cvls_psetup, cvls_psolve);
  if (retval != SUNLS_SUCCESS) {
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS",
                   "CVLsSetPreconditioner",
                   "Error in calling SUNLinSolSetPreconditioner");
    return(CVLS_SUNLS_FAIL);
  }

  return(CVLS_SUCCESS);
}